

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(basic_appender<char> out,char value)

{
  size_t sVar1;
  buffer<char> *buf;
  ulong uVar2;
  
  uVar2 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar2) {
    (*(out.container)->grow_)(out.container,uVar2);
  }
  uVar2 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar2) {
    (*(out.container)->grow_)(out.container,uVar2);
  }
  sVar1 = (out.container)->size_;
  (out.container)->size_ = sVar1 + 1;
  (out.container)->ptr_[sVar1] = value;
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value) -> OutputIt {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}